

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

void __thiscall xemmai::t_directory::t_directory(t_directory *this,wstring_view a_path)

{
  string_type local_68;
  path local_48;
  t_directory *local_20;
  t_directory *this_local;
  wstring_view a_path_local;
  
  a_path_local._M_len = (size_t)a_path._M_str;
  this_local = (t_directory *)a_path._M_len;
  local_20 = this;
  t_owned::t_owned(&this->super_t_owned);
  xemmai::portable::f_convert_abi_cxx11_(&local_68,this_local,a_path_local._M_len);
  std::filesystem::__cxx11::path::path(&local_48,&local_68,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&this->v_i,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

t_directory(std::wstring_view a_path) : v_i(portable::f_convert(a_path))
	{
	}